

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

AliasRet aa_fref(jit_State *J,IRIns *refa,IRIns *refb)

{
  ushort uVar1;
  ushort uVar2;
  IRIns *pIVar3;
  IRIns *pIVar4;
  IRIns *pIVar5;
  IRIns *pIVar6;
  byte bVar7;
  byte bVar8;
  
  if ((refa->field_0).op2 != (refb->field_0).op2) {
    return ALIAS_NO;
  }
  uVar1 = (refa->field_0).op1;
  uVar2 = (refb->field_0).op1;
  if (uVar1 != uVar2) {
    if (5 < (ushort)((refa->field_0).op2 - 3)) {
      return ALIAS_MAY;
    }
    pIVar3 = (J->cur).ir;
    bVar7 = *(byte *)((long)pIVar3 + (ulong)uVar1 * 8 + 5) & 0xfe;
    bVar8 = *(byte *)((long)pIVar3 + (ulong)uVar2 * 8 + 5) & 0xfe;
    if ((bVar7 != 0x4e) || (bVar8 != 0x4e)) {
      pIVar6 = pIVar3 + uVar1;
      pIVar5 = pIVar3 + uVar2;
      if ((bVar8 != 0x4e) && (pIVar5 = pIVar6, pIVar6 = pIVar3 + uVar2, bVar7 != 0x4e)) {
        return ALIAS_MAY;
      }
      pIVar4 = pIVar5 + 1;
      if (pIVar4 < pIVar6) {
        do {
          if (((uint)(pIVar4->field_0).op2 == (uint)((ulong)((long)pIVar5 - (long)pIVar3) >> 3)) &&
             ((byte)((pIVar4->field_1).o + 0xb9) < 4)) {
            return ALIAS_MAY;
          }
          pIVar4 = pIVar4 + 1;
        } while (pIVar4 < pIVar6);
      }
    }
    return ALIAS_NO;
  }
  return ALIAS_MUST;
}

Assistant:

static AliasRet aa_fref(jit_State *J, IRIns *refa, IRIns *refb)
{
  if (refa->op2 != refb->op2)
    return ALIAS_NO;  /* Different fields. */
  if (refa->op1 == refb->op1)
    return ALIAS_MUST;  /* Same field, same object. */
  else if (refa->op2 >= IRFL_TAB_META && refa->op2 <= IRFL_TAB_NOMM)
    return aa_table(J, refa->op1, refb->op1);  /* Disambiguate tables. */
  else
    return ALIAS_MAY;  /* Same field, possibly different object. */
}